

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_rules.c
# Opt level: O0

void CGTFS_RecordFareRule(void)

{
  int iVar1;
  greatest_test_res local_10;
  greatest_test_res local_c;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("fare_rule_read");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = fare_rule_read();
    }
    greatest_test_post(local_c);
  }
  iVar1 = greatest_test_pre("fare_rule_compare");
  if (iVar1 == 1) {
    local_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_10 == GREATEST_TEST_RES_PASS) {
      local_10 = fare_rule_compare();
    }
    greatest_test_post(local_10);
  }
  return;
}

Assistant:

SUITE(CGTFS_RecordFareRule) {
    RUN_TEST(fare_rule_read);
    RUN_TEST(fare_rule_compare);
}